

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O3

QVariant * __thiscall
SongListModel::data(QVariant *__return_storage_ptr__,SongListModel *this,QModelIndex *index,int role
                   )

{
  int iVar1;
  pointer args_1;
  QString local_58;
  QString local_40;
  type local_28;
  
  iVar1 = index->r;
  if (((((long)iVar1 < 0) || (index->c < 0)) || (index->m == (QAbstractItemModel *)0x0)) ||
     ((role & 0xfffffffdU) != 0)) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    args_1 = (this->mSongData).
             super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>.
             _M_impl.super__Vector_impl_data._M_start + iVar1;
    if (role == 0) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = L"%1# %2";
      local_58.d.size = 6;
      QString::number((int)&local_40,iVar1 + 1);
      QString::arg<QString,QString_const&>(&local_28,&local_58,&local_40,&args_1->name);
      QVariant::QVariant(__return_storage_ptr__,&local_28);
      if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,8);
        }
      }
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,8);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
        }
      }
    }
    else {
      QVariant::QVariant(__return_storage_ptr__,&args_1->name);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant SongListModel::data(QModelIndex const& index, int role) const {

    if (index.isValid()) {
        switch (role) {
            case Qt::DisplayRole:
            case Qt::EditRole: {
                auto const& meta = mSongData[index.row()];
                if (role == Qt::DisplayRole) {
                    return QStringLiteral("%1# %2").arg(QString::number(index.row() + 1), meta.name);
                } else {
                    return meta.name;
                }
            }
            default:
                break;
        }
    }

    return {};

}